

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O0

int * __thiscall
frozen::bits::LowerBound<int,std::less<int>>::doitfirst<int_const*,2ul>
          (LowerBound<int,std::less<int>> *this,int *first)

{
  bool bVar1;
  unsigned_long next;
  int *it;
  size_t next_start;
  size_t next_power;
  int *first_local;
  LowerBound<int,_std::less<int>_> *this_local;
  int *local_10;
  
  bVar1 = std::less<int>::operator()(*(less<int> **)(this + 8),first,*(int **)this);
  if (bVar1) {
    local_10 = doitfirst<int_const*>(this,first + 1);
  }
  else {
    local_10 = doit_fast<int_const*>(this,first);
  }
  return local_10;
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }